

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

void __thiscall hierarchy_info::deriveLevels(hierarchy_info *this,AddrUnsPair *adr2os,int num_addrs)

{
  uint uVar1;
  int next;
  int j;
  int max;
  int i;
  int level;
  int hier_depth;
  int num_addrs_local;
  AddrUnsPair *adr2os_local;
  hierarchy_info *this_local;
  
  i = (adr2os->first).depth;
  level = 0;
  while (i = i - 1, -1 < i) {
    max = -1;
    for (j = 0; j < num_addrs; j = j + 1) {
      uVar1 = adr2os[j].first.childNums[i];
      if (max < (int)uVar1) {
        max = uVar1;
      }
    }
    this->numPerLevel[level] = max + 1;
    level = level + 1;
  }
  return;
}

Assistant:

void deriveLevels(AddrUnsPair *adr2os, int num_addrs) {
    int hier_depth = adr2os[0].first.depth;
    int level = 0;
    for (int i = hier_depth - 1; i >= 0; --i) {
      int max = -1;
      for (int j = 0; j < num_addrs; ++j) {
        int next = adr2os[j].first.childNums[i];
        if (next > max)
          max = next;
      }
      numPerLevel[level] = max + 1;
      ++level;
    }
  }